

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O2

int ShouldCompress(uint8_t *data,size_t mask,uint64_t last_flush_pos,size_t bytes,
                  size_t num_literals,size_t num_commands)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  uint32_t literal_histo [256];
  
  if ((num_commands < (bytes >> 8) + 2) &&
     (auVar7._8_4_ = (int)(num_literals >> 0x20), auVar7._0_8_ = num_literals,
     auVar7._12_4_ = 0x45300000, auVar8._8_4_ = (int)(bytes >> 0x20), auVar8._0_8_ = bytes,
     auVar8._12_4_ = 0x45300000,
     dVar10 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)bytes) - 4503599627370496.0),
     dVar10 * 0.99 <
     (auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0))) {
    memset(literal_histo,0,0x400);
    uVar1 = (bytes + 0xc) / 0xd;
    while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
      literal_histo[data[(uint)last_flush_pos & (uint)mask]] =
           literal_histo[data[(uint)last_flush_pos & (uint)mask]] + 1;
      last_flush_pos = (uint64_t)((uint)last_flush_pos + 0xd);
    }
    dVar11 = 0.0;
    uVar1 = 0;
    for (uVar4 = 0; uVar4 < 0x400; uVar4 = uVar4 + 8) {
      uVar2 = (ulong)*(uint *)((long)literal_histo + uVar4);
      if (uVar2 < 0x100) {
        dVar12 = (double)kLog2Table[uVar2];
      }
      else {
        dVar12 = log2((double)uVar2);
      }
      uVar3 = (ulong)*(uint *)((long)literal_histo + uVar4 + 4);
      if (uVar3 < 0x100) {
        dVar6 = (double)kLog2Table[uVar3];
      }
      else {
        dVar6 = log2((double)uVar3);
      }
      uVar1 = uVar1 + uVar2 + uVar3;
      dVar11 = (dVar11 - (double)uVar2 * dVar12) - (double)uVar3 * dVar6;
    }
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    dVar12 = (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    if (uVar1 != 0) {
      if (uVar1 < 0x100) {
        dVar6 = (double)kLog2Table[uVar1];
      }
      else {
        dVar6 = log2(dVar12);
      }
      dVar11 = dVar11 + dVar6 * dVar12;
    }
    if (dVar12 <= dVar11) {
      dVar12 = dVar11;
    }
    if ((dVar10 * 7.92) / 13.0 < dVar12) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* input, size_t input_size, size_t num_literals) {
  double corpus_size = (double)input_size;
  if (num_literals < MIN_RATIO * corpus_size) {
    return BROTLI_TRUE;
  } else {
    uint32_t literal_histo[256] = { 0 };
    const double max_total_bit_cost = corpus_size * 8 * MIN_RATIO / SAMPLE_RATE;
    size_t i;
    for (i = 0; i < input_size; i += SAMPLE_RATE) {
      ++literal_histo[input[i]];
    }
    return TO_BROTLI_BOOL(BitsEntropy(literal_histo, 256) < max_total_bit_cost);
  }
}